

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

object_ptr __thiscall mjs::global_object_impl::to_object(global_object_impl *this,value *v)

{
  bool val;
  value_type vVar1;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  native_error_exception *this_00;
  string *val_00;
  object_ptr *p;
  wostream *pwVar3;
  value *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar4;
  double val_01;
  object_ptr oVar5;
  wstring local_3e8 [32];
  wstring_view local_3c8;
  wostringstream local_3b8 [8];
  wostringstream _woss;
  undefined1 local_240 [32];
  object_ptr local_220;
  undefined1 local_209;
  wstring local_208 [32];
  wstring_view local_1e8;
  wstring local_1d8;
  wstring_view local_1b8 [2];
  wostringstream local_198 [8];
  wostringstream woss;
  value *v_local;
  global_object_impl *this_local;
  
  vVar1 = value::type(in_RDX);
  switch(vVar1) {
  case undefined:
  case null:
    std::__cxx11::wostringstream::wostringstream(local_198);
    pwVar3 = std::operator<<((wostream *)local_198,"Cannot convert ");
    vVar1 = value::type(in_RDX);
    pbVar2 = mjs::operator<<(pwVar3,vVar1);
    std::operator<<(pbVar2," to object");
    local_209 = '\x01';
    this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
    global_object::stack_trace_abi_cxx11_(&local_1d8,(global_object *)v);
    local_1b8[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_1d8);
    std::__cxx11::wostringstream::str();
    local_1e8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_208);
    native_error_exception::native_error_exception(this_00,type,local_1b8,&local_1e8);
    local_209 = '\0';
    __cxa_throw(this_00,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  case boolean:
    object::heap((object *)v);
    gc_heap_ptr_untracked<mjs::object,_true>::track
              ((gc_heap_ptr_untracked<mjs::object,_true> *)&local_220,
               (gc_heap *)
               ((long)&v[3].field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                       heap_ + 4));
    val = value::boolean_value(in_RDX);
    new_boolean((mjs *)this,&local_220,val);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_220);
    uVar4 = extraout_RDX;
    break;
  case number:
    object::heap((object *)v);
    gc_heap_ptr_untracked<mjs::object,_true>::track
              ((gc_heap_ptr_untracked<mjs::object,_true> *)(local_240 + 0x10),
               (gc_heap *)
               &v[3].field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
    val_01 = value::number_value(in_RDX);
    new_number((mjs *)this,(object_ptr *)(local_240 + 0x10),val_01);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)(local_240 + 0x10));
    uVar4 = extraout_RDX_00;
    break;
  case string:
    self_ptr((global_object_impl *)local_240);
    val_00 = value::string_value(in_RDX);
    new_string((mjs *)this,(gc_heap_ptr<mjs::global_object> *)local_240,val_00);
    gc_heap_ptr<mjs::global_object>::~gc_heap_ptr((gc_heap_ptr<mjs::global_object> *)local_240);
    uVar4 = extraout_RDX_01;
    break;
  case object:
    p = value::object_value(in_RDX);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)this,p);
    uVar4 = extraout_RDX_02;
    break;
  default:
    std::__cxx11::wostringstream::wostringstream(local_3b8);
    pwVar3 = std::operator<<((wostream *)local_3b8,"Not implemented: ");
    vVar1 = value::type(in_RDX);
    mjs::operator<<(pwVar3,vVar1);
    std::__cxx11::wostringstream::str();
    local_3c8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_3e8);
    throw_runtime_error(&local_3c8,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                        ,0x244);
  }
  oVar5.super_gc_heap_ptr_untyped._8_8_ = uVar4;
  oVar5.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar5.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr to_object(const value& v) override {
        switch (v.type()) {
            // undefined and null give runtime errors
        case value_type::undefined:
        case value_type::null:
            {
                std::wostringstream woss;
                woss << "Cannot convert " << v.type() << " to object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
        case value_type::boolean: return new_boolean(boolean_prototype_.track(heap()), v.boolean_value());
        case value_type::number:  return new_number(number_prototype_.track(heap()), v.number_value());
        case value_type::string:  return new_string(self_ptr(), v.string_value());
        case value_type::object:  return v.object_value();
        default:
            NOT_IMPLEMENTED(v.type());
        }
    }